

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O0

void __thiscall
de::cmdline::Option<de::cmdline::TestNamedOpt>::Option
          (Option<de::cmdline::TestNamedOpt> *this,char *shortName_,char *longName_,
          char *description_,NamedValue<unsigned_long> *namedValues_,
          NamedValue<unsigned_long> *namedValuesEnd_,char *defaultValue_)

{
  NamedValue<unsigned_long> *namedValuesEnd__local;
  NamedValue<unsigned_long> *namedValues__local;
  char *description__local;
  char *longName__local;
  char *shortName__local;
  Option<de::cmdline::TestNamedOpt> *this_local;
  
  this->shortName = shortName_;
  this->longName = longName_;
  this->description = description_;
  this->defaultValue = defaultValue_;
  this->parse = (ParseFunc)0x0;
  this->namedValues = namedValues_;
  this->namedValuesEnd = namedValuesEnd_;
  return;
}

Assistant:

Option (const char* shortName_, const char* longName_, const char* description_, const NamedValue<ValueType>* namedValues_, const NamedValue<ValueType>* namedValuesEnd_, const char* defaultValue_ = DE_NULL)
		: shortName		(shortName_)
		, longName		(longName_)
		, description	(description_)
		, defaultValue	(defaultValue_)
		, parse			((ParseFunc)DE_NULL)
		, namedValues	(namedValues_)
		, namedValuesEnd(namedValuesEnd_)
	{
	}